

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

Float __thiscall pbrt::HaltonSampler::SampleDimension(HaltonSampler *this,int dimension)

{
  DigitPermutation *pDVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  float fVar9;
  Float FVar10;
  undefined1 auVar11 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM3 [64];
  undefined1 in_XMM4 [16];
  
  switch(this->randomizeStrategy) {
  case None:
    if (this->haltonIndex == 0) {
      auVar11 = ZEXT816(0) << 0x40;
    }
    else {
      lVar5 = 0;
      uVar3 = (ulong)(int)(&Primes)[dimension];
      fVar9 = 1.0;
      uVar4 = this->haltonIndex;
      do {
        fVar9 = (1.0 / (float)(int)(&Primes)[dimension]) * fVar9;
        lVar5 = (lVar5 - uVar4 / uVar3) * uVar3 + uVar4;
        bVar8 = uVar3 <= uVar4;
        uVar4 = uVar4 / uVar3;
      } while (bVar8);
      auVar11 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,lVar5);
      auVar11 = ZEXT416((uint)(fVar9 * auVar11._0_4_));
    }
    break;
  case CranleyPatterson:
    uVar4 = (long)dimension << 0x20;
    uVar4 = (uVar4 >> 0x1f ^ uVar4 + 1) * 0x7fb5d329728ea185;
    lVar5 = (uVar4 >> 0x1b ^ uVar4) * -0x7e25210b43d22bb3;
    auVar11 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,(uint)((ulong)lVar5 >> 0x21) ^ (uint)lVar5);
    if (this->haltonIndex == 0) {
      auVar12 = ZEXT816(0) << 0x40;
    }
    else {
      fVar9 = 1.0;
      lVar5 = 0;
      uVar3 = (ulong)(int)(&Primes)[dimension];
      uVar4 = this->haltonIndex;
      do {
        fVar9 = (1.0 / (float)(int)(&Primes)[dimension]) * fVar9;
        lVar5 = (lVar5 - uVar4 / uVar3) * uVar3 + uVar4;
        bVar8 = uVar3 <= uVar4;
        uVar4 = uVar4 / uVar3;
      } while (bVar8);
      auVar12 = vcvtusi2ss_avx512f(in_ZMM3._0_16_,lVar5);
      auVar12 = ZEXT416((uint)(fVar9 * auVar12._0_4_));
    }
    auVar12 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar12);
    fVar9 = auVar11._0_4_ * 2.3283064e-10 + auVar12._0_4_;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar9),ZEXT416(0x3f800000),9);
    bVar8 = (bool)((byte)uVar2 & 1);
    return (Float)((uint)bVar8 * (int)fVar9 + (uint)!bVar8 * (int)(fVar9 + -1.0));
  case PermuteDigits:
    iVar6 = 0;
    lVar5 = 0;
    pDVar1 = this->digitPermutations->ptr;
    uVar3 = (ulong)(int)(&Primes)[dimension];
    fVar9 = 1.0;
    uVar4 = this->haltonIndex;
    do {
      iVar7 = iVar6 * pDVar1[dimension].base;
      fVar9 = (1.0 / (float)(int)(&Primes)[dimension]) * fVar9;
      iVar6 = iVar6 + 1;
      lVar5 = (ulong)pDVar1[dimension].permutations[iVar7 + (int)(uVar4 % uVar3)] + lVar5 * uVar3;
      uVar4 = uVar4 / uVar3;
    } while (1.0 - fVar9 < 1.0);
    auVar11 = vcvtusi2ss_avx512f(in_XMM4,lVar5);
    auVar11 = ZEXT416((uint)(fVar9 * auVar11._0_4_));
    break;
  default:
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/samplers.h"
             ,0x88,"Unhandled randomization strategy");
  case Owen:
    uVar4 = (((ulong)(uint)dimension << 0x20) >> 0x1f ^ ((ulong)(uint)dimension << 0x20) + 1) *
            0x7fb5d329728ea185;
    lVar5 = (uVar4 >> 0x1b ^ uVar4) * -0x7e25210b43d22bb3;
    FVar10 = OwenScrambledRadicalInverse
                       (dimension,this->haltonIndex,(uint)((ulong)lVar5 >> 0x21) ^ (uint)lVar5);
    return FVar10;
  }
  auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar11);
  return auVar11._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float SampleDimension(int dimension) const {
        switch (randomizeStrategy) {
        case RandomizeStrategy::None:
            return RadicalInverse(dimension, haltonIndex);
        case RandomizeStrategy::CranleyPatterson: {
            Float u = uint32_t(MixBits(1 + (uint64_t(dimension) << 32))) * 0x1p-32f;
            Float s = RadicalInverse(dimension, haltonIndex) + u;
            if (s >= 1)
                s -= 1;
            return s;
        }
        case RandomizeStrategy::PermuteDigits:
            return ScrambledRadicalInverse(dimension, haltonIndex,
                                           (*digitPermutations)[dimension]);
        case RandomizeStrategy::Owen:
            return OwenScrambledRadicalInverse(dimension, haltonIndex,
                                               MixBits(1 + (uint64_t(dimension) << 32)));
        default:
            LOG_FATAL("Unhandled randomization strategy");
            return {};
        }
    }